

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3tokColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  int iVar1;
  sqlite3_vtab *z;
  
  switch(iCol) {
  case 0:
    z = pCursor[1].pVtab;
    iVar1 = -1;
    goto LAB_001c2f8b;
  case 1:
    z = pCursor[4].pVtab;
    iVar1 = *(int *)&pCursor[5].pVtab;
LAB_001c2f8b:
    sqlite3_result_text(pCtx,(char *)z,iVar1,(_func_void_void_ptr *)0xffffffffffffffff);
    return 0;
  case 2:
    iVar1 = *(int *)((long)&pCursor[5].pVtab + 4);
    break;
  case 3:
    iVar1 = *(int *)&pCursor[6].pVtab;
    break;
  default:
    iVar1 = *(int *)((long)&pCursor[6].pVtab + 4);
  }
  sqlite3_result_int(pCtx,iVar1);
  return 0;
}

Assistant:

static int fts3tokColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  Fts3tokCursor *pCsr = (Fts3tokCursor *)pCursor;

  /* CREATE TABLE x(input, token, start, end, position) */
  switch( iCol ){
    case 0:
      sqlite3_result_text(pCtx, pCsr->zInput, -1, SQLITE_TRANSIENT);
      break;
    case 1:
      sqlite3_result_text(pCtx, pCsr->zToken, pCsr->nToken, SQLITE_TRANSIENT);
      break;
    case 2:
      sqlite3_result_int(pCtx, pCsr->iStart);
      break;
    case 3:
      sqlite3_result_int(pCtx, pCsr->iEnd);
      break;
    default:
      assert( iCol==4 );
      sqlite3_result_int(pCtx, pCsr->iPos);
      break;
  }
  return SQLITE_OK;
}